

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug operator<<(QDebug debug,QSharedPointer<char> *ptr)

{
  char *pcVar1;
  QDebug *pQVar2;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_30,(QDebug *)ptr);
  (ptr->value).ptr[0x30] = '\0';
  pQVar2 = QDebug::operator<<((QDebug *)ptr,"QSharedPointer(");
  pQVar2 = QDebug::operator<<(pQVar2,(char *)*in_RDX);
  QDebug::operator<<(pQVar2,")");
  pcVar1 = (ptr->value).ptr;
  (ptr->value).ptr = (char *)0x0;
  *(char **)debug.stream = pcVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug operator<<(QDebug debug, const QSharedPointer<T> &ptr)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QSharedPointer(" << ptr.data() << ")";
    return debug;
}